

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strings.c
# Opt level: O2

void test_sbs_strcat(CuTest *tc)

{
  char buffer [8];
  sbstring sbs;
  
  sbs_init(&sbs,buffer,8);
  sbs_strcat(&sbs,"AB");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x114,(char *)0x0,"AB",sbs.begin);
  sbs_strcat(&sbs,(char *)0x0);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x116,(char *)0x0,"AB",sbs.begin);
  sbs_strcat(&sbs,"CD");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x118,(char *)0x0,"ABCD",sbs.begin);
  sbs_init(&sbs,buffer,8);
  sbs_strcat(&sbs,"12345678901234567890");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x11c,(char *)0x0,"1234567",sbs.begin);
  sbs_strcat(&sbs,"12345678901234567890");
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x11e,(char *)0x0,"1234567",sbs.begin);
  sbs_init(&sbs,buffer,8);
  sbs_strncat(&sbs,"12345678901234567890",4);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x122,(char *)0x0,"1234",sbs.begin);
  sbs_strncat(&sbs,(char *)0x0,4);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x124,(char *)0x0,"1234",sbs.begin);
  sbs_strncat(&sbs,"12345678901234567890",4);
  CuAssertStrEquals_LineMsg
            (tc,
             "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_strings.c",
             0x126,(char *)0x0,"1234123",sbs.begin);
  return;
}

Assistant:

static void test_sbs_strcat(CuTest * tc)
{
    char buffer[8];
    sbstring sbs;

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strcat(&sbs, "AB");
    CuAssertStrEquals(tc, "AB", sbs.begin);
    sbs_strcat(&sbs, NULL);
    CuAssertStrEquals(tc, "AB", sbs.begin);
    sbs_strcat(&sbs, "CD");
    CuAssertStrEquals(tc, "ABCD", sbs.begin);

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strcat(&sbs, "12345678901234567890");
    CuAssertStrEquals(tc, "1234567", sbs.begin);
    sbs_strcat(&sbs, "12345678901234567890");
    CuAssertStrEquals(tc, "1234567", sbs.begin);

    sbs_init(&sbs, buffer, sizeof(buffer));
    sbs_strncat(&sbs, "12345678901234567890", 4);
    CuAssertStrEquals(tc, "1234", sbs.begin);
    sbs_strncat(&sbs, NULL, 4);
    CuAssertStrEquals(tc, "1234", sbs.begin);
    sbs_strncat(&sbs, "12345678901234567890", 4);
    CuAssertStrEquals(tc, "1234123", sbs.begin);
}